

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O1

void __thiscall
cfd::core::ConfidentialTransaction::CheckTxInIndex
          (ConfidentialTransaction *this,uint32_t index,int line,char *caller)

{
  CfdException *this_00;
  ulong uVar1;
  CfdSourceLocation location;
  uint32_t local_5c;
  string local_58;
  CfdSourceLocation local_38;
  
  uVar1 = ((long)(this->vin_).
                 super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->vin_).
                 super__Vector_base<cfd::core::ConfidentialTxIn,_std::allocator<cfd::core::ConfidentialTxIn>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 5) * 0x2e8ba2e8ba2e8ba3;
  if (index <= uVar1 && uVar1 - index != 0) {
    return;
  }
  local_38.filename = "cfdcore_elements_transaction.cpp";
  local_5c = index;
  local_38.line = line;
  local_38.funcname = caller;
  logger::log<unsigned_int&>(&local_38,kCfdLogLevelWarning,"vin[{}] out_of_range.",&local_5c);
  this_00 = (CfdException *)__cxa_allocate_exception(0x30);
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_58,"vin out_of_range error.","");
  CfdException::CfdException(this_00,kCfdOutOfRangeError,&local_58);
  __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
}

Assistant:

void ConfidentialTransaction::CheckTxInIndex(
    uint32_t index, int line, const char *caller) const {
  if (vin_.size() <= index) {
    cfd::core::logger::CfdSourceLocation location = {
        CFD_LOG_FILE, line, caller};
    warn(location, "vin[{}] out_of_range.", index);
    throw CfdException(kCfdOutOfRangeError, "vin out_of_range error.");
  }
}